

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

void __thiscall LLVMBC::BasicBlock::add_successor(BasicBlock *this,BasicBlock *succ)

{
  pointer *pppBVar1;
  iterator __position;
  __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var2;
  BasicBlock *local_10;
  
  local_10 = succ;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<LLVMBC::BasicBlock**,std::vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<LLVMBC::BasicBlock*const>>
                    ((this->succs).
                     super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->succs).
                     super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->succs).
       super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (__position._M_current ==
        (this->succs).
        super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>>::
      _M_realloc_insert<LLVMBC::BasicBlock*const&>
                ((vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>> *)
                 &this->succs,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppBVar1 = &(this->succs).
                  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  return;
}

Assistant:

void BasicBlock::add_successor(BasicBlock *succ)
{
	if (std::find(succs.begin(), succs.end(), succ) == succs.end())
		succs.push_back(succ);
}